

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqContextManager.cpp
# Opt level: O0

void __thiscall ZmqContextManager::~ZmqContextManager(ZmqContextManager *this)

{
  bool bVar1;
  atomic<bool> *in_RDI;
  context_t *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  bVar1 = std::atomic::operator_cast_to_bool(in_RDI);
  if (bVar1) {
    in_stack_fffffffffffffff0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::unique_ptr<zmq::context_t,_std::default_delete<zmq::context_t>_>::release
                   ((unique_ptr<zmq::context_t,_std::default_delete<zmq::context_t>_> *)0x4e2d7e);
  }
  std::unique_ptr<zmq::context_t,_std::default_delete<zmq::context_t>_>::~unique_ptr
            ((unique_ptr<zmq::context_t,_std::default_delete<zmq::context_t>_> *)
             in_stack_fffffffffffffff0);
  std::__cxx11::string::~string(in_stack_fffffffffffffff0);
  return;
}

Assistant:

ZmqContextManager::~ZmqContextManager()
{
    // std::cout << "destroying context in " << std::this_thread::get_id() << std::endl;

    if (leakOnDelete) {
        // yes I am purposefully leaking this( PHILIP TOP)
        // do the vagaries of library closeout this may end up being destroyed too soon and can
        // cause some extraneous errors to show up when closing programs, so this just lets the OS
        // process cleanup since the only issues occur on program termination, in other situations
        // closing does present an issue and since this particular object is mostly only closed on
        // termination this is the default.
        auto* val = zcontext.release();
        (void)(val);
    }
}